

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTagDecls(CWriter *this)

{
  bool bVar1;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *this_00;
  reference ppTVar2;
  size_type sVar3;
  string_view name;
  Newline local_81;
  GlobalName local_80;
  string_view local_70;
  string local_60;
  Newline local_3b [2];
  undefined1 local_39;
  Tag *pTStack_38;
  bool is_import;
  Tag *tag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *__range2;
  Index tag_index;
  CWriter *this_local;
  
  __range2._4_4_ = 0;
  this_00 = &this->module_->tags;
  __end2 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::begin(this_00);
  tag = (Tag *)std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>
                                *)&tag);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>
              ::operator*(&__end2);
    pTStack_38 = *ppTVar2;
    local_39 = __range2._4_4_ < this->module_->num_tag_imports;
    if (!(bool)local_39) {
      if (__range2._4_4_ == this->module_->num_tag_imports) {
        Write(this);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[37],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [37])"typedef char wasm_tag_placeholder_t;",local_3b);
      }
      name = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_38);
      local_70 = name;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                (&local_60,(CWriter *)this,Tag,name);
      std::__cxx11::string::~string((string *)&local_60);
      sVar3 = std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::size(&this->c_streams_);
      if (1 < sVar3) {
        GlobalName::GlobalName(&local_80,Tag,&pTStack_38->name);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[37],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [37])"extern const wasm_tag_placeholder_t ",&local_80,
                   (char (*) [2])0x37ca1e,&local_81);
      }
    }
    __range2._4_4_ = __range2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void CWriter::WriteTagDecls() {
  Index tag_index = 0;
  for (const Tag* tag : module_->tags) {
    bool is_import = tag_index < module_->num_tag_imports;
    if (!is_import) {
      // Tags are identified and compared solely by their (unique) address.
      // The data stored in this variable is never read.
      if (tag_index == module_->num_tag_imports) {
        Write(Newline());
        Write("typedef char wasm_tag_placeholder_t;", Newline());
      }
      DefineGlobalScopeName(ModuleFieldType::Tag, tag->name);
      if (c_streams_.size() > 1) {
        Write("extern const wasm_tag_placeholder_t ",
              GlobalName(ModuleFieldType::Tag, tag->name), ";", Newline());
      }
    }
    tag_index++;
  }
}